

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

void crnlib::crn_sleep(uint milliseconds)

{
  undefined4 local_14;
  undefined4 local_c;
  int msecs_to_sleep;
  uint milliseconds_local;
  
  for (local_c = milliseconds; local_c != 0; local_c = local_c - local_14) {
    if (local_c < 1000) {
      local_14 = local_c;
    }
    else {
      local_14 = 1000;
    }
    usleep(local_14 * 1000);
  }
  return;
}

Assistant:

void crn_sleep(unsigned int milliseconds) {
#ifdef WIN32
  struct timespec interval;
  interval.tv_sec = milliseconds / 1000;
  interval.tv_nsec = (milliseconds % 1000) * 1000000L;
  pthread_delay_np(&interval);
#else
  while (milliseconds) {
    int msecs_to_sleep = CRNLIB_MIN(milliseconds, 1000);
    usleep(msecs_to_sleep * 1000);
    milliseconds -= msecs_to_sleep;
  }
#endif
}